

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O2

string_view __thiscall
gmlc::utilities::string_viewOps::removeQuotes(string_viewOps *this,string_view str)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  uint uVar4;
  string_view trimCharacters;
  string_view input;
  string_view ret;
  byte *pbVar3;
  
  input._M_str = (char *)str._M_len;
  trimCharacters._M_str = " \t\n\r";
  trimCharacters._M_len = 4;
  input._M_len = (size_t)this;
  ret = trim(input,trimCharacters);
  pbVar3 = (byte *)ret._M_str;
  sVar2 = ret._M_len;
  if (sVar2 == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pbVar3;
    ret = (string_view)(auVar1 << 0x40);
  }
  else {
    uVar4 = *pbVar3 - 0x22;
    if (((uVar4 < 0x3f) && ((0x4000000000000021U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) &&
       (pbVar3[sVar2 - 1] == *pbVar3)) {
      ret = (string_view)
            std::basic_string_view<char,_std::char_traits<char>_>::substr(&ret,1,sVar2 - 2);
    }
  }
  return ret;
}

Assistant:

std::string_view removeQuotes(std::string_view str)
{
    std::string_view ret = trim(str);
    if (!ret.empty()) {
        if ((ret.front() == '\"') || (ret.front() == '\'') ||
            (ret.front() == '`')) {
            if (ret.back() == ret.front()) {
                return ret.substr(1, ret.size() - 2);
            }
        }
    }
    return ret;
}